

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randen.cc
# Opt level: O3

void __thiscall absl::lts_20250127::random_internal::Randen::Randen(Randen *this)

{
  byte bVar1;
  int iVar2;
  anon_class_1_0_00000001 *this_00;
  RandenState RVar3;
  
  if (random_internal::(anonymous_namespace)::GetRandenState()::state == '\0') {
    this_00 = (anon_class_1_0_00000001 *)
              &random_internal::(anonymous_namespace)::GetRandenState()::state;
    iVar2 = __cxa_guard_acquire();
    if (iVar2 != 0) {
      RVar3 = anon_unknown_0::GetRandenState::anon_class_1_0_00000001::operator()(this_00);
      random_internal::(anonymous_namespace)::GetRandenState()::state = RVar3.keys;
      DAT_0057a198 = RVar3.has_crypto;
      __cxa_guard_release(&random_internal::(anonymous_namespace)::GetRandenState()::state);
    }
  }
  bVar1 = DAT_0057a198;
  this->keys_ = random_internal::(anonymous_namespace)::GetRandenState()::state;
  this->has_crypto_ = (bool)(bVar1 & 1);
  return;
}

Assistant:

Randen::Randen() {
  auto tmp = GetRandenState();
  keys_ = tmp.keys;
#if ABSL_RANDOM_INTERNAL_AES_DISPATCH
  has_crypto_ = tmp.has_crypto;
#endif
}